

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Reader capnp::_::WireHelpers::readTextPointer
                 (SegmentReader *segment,WirePointer *ref,word *refTarget,void *defaultValue,
                 ByteCount defaultSize)

{
  word *pwVar1;
  char *value;
  WirePointer *segment_00;
  bool bVar2;
  uint uVar3;
  WordCount size_00;
  Fault local_180;
  Fault f_4;
  char *local_170;
  undefined1 local_168 [8];
  DebugComparison<const_char_&,_char> _kjCondition_4;
  uint unboundedSize;
  char *cptr;
  Fault f_3;
  uint *local_120;
  undefined1 local_118 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition_3;
  Fault f_2;
  DebugExpression<bool> _kjCondition_2;
  Fault f_1;
  undefined1 local_d0 [8];
  DebugComparison<capnp::ElementSize,_capnp::ElementSize> _kjCondition_1;
  Fault local_a0;
  Fault f;
  Kind local_90;
  DebugExpression<capnp::_::WirePointer::Kind> local_8c;
  undefined1 local_88 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  uint size;
  word *p;
  word *local_50;
  word *_p2455;
  word *ptr;
  char *pcStack_38;
  ByteCount defaultSize_local;
  void *defaultValue_local;
  word *refTarget_local;
  WirePointer *ref_local;
  SegmentReader *segment_local;
  
  ptr._4_4_ = defaultSize;
  pcStack_38 = (char *)defaultValue;
  defaultValue_local = refTarget;
  refTarget_local = (word *)ref;
  ref_local = (WirePointer *)segment;
  bVar2 = WirePointer::isNull(ref);
  if (!bVar2) {
    followFars((WireHelpers *)&p,(WirePointer **)&refTarget_local,(word *)defaultValue_local,
               (SegmentReader **)&ref_local);
    local_50 = kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&p);
    if (local_50 != (word *)0x0) {
      _p2455 = local_50;
      _kjCondition._28_4_ =
           WirePointer::ListRef::elementCount((ListRef *)((long)&refTarget_local->content + 4));
      local_90 = WirePointer::kind((WirePointer *)refTarget_local);
      local_8c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
      f.exception._4_4_ = 1;
      kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 local_88,&local_8c,(Kind *)((long)&f.exception + 4));
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
      if (bVar2) {
        f_1.exception._6_1_ =
             WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
        f_1.exception._7_1_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (ElementSize *)((long)&f_1.exception + 6));
        f_1.exception._5_1_ = 2;
        kj::_::DebugExpression<capnp::ElementSize>::operator==
                  ((DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)local_d0,
                   (DebugExpression<capnp::ElementSize> *)((long)&f_1.exception + 7),
                   (ElementSize *)((long)&f_1.exception + 5));
        bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
        segment_00 = ref_local;
        pwVar1 = _p2455;
        if (bVar2) {
          size_00 = roundBytesUpToWords(_kjCondition._28_4_);
          f_2.exception._6_1_ = boundsCheck((SegmentReader *)segment_00,pwVar1,size_00);
          f_2.exception._7_1_ =
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&f_2.exception + 6));
          bVar2 = kj::_::DebugExpression::operator_cast_to_bool
                            ((DebugExpression *)((long)&f_2.exception + 7));
          if (bVar2) {
            local_120 = (uint *)kj::_::DebugExpressionStart::operator<<
                                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                           (uint *)&_kjCondition.field_0x1c);
            f_3.exception._4_4_ = 0;
            kj::_::DebugExpression<unsigned_int&>::operator>
                      ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_118,
                       (DebugExpression<unsigned_int&> *)&local_120,
                       (uint *)((long)&f_3.exception + 4));
            bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
            pwVar1 = _p2455;
            if (bVar2) {
              uVar3 = unbound<unsigned_int>(_kjCondition._28_4_);
              _kjCondition_4._36_4_ = uVar3 - 1;
              local_170 = (char *)kj::_::DebugExpressionStart::operator<<
                                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                             (char *)((long)&pwVar1->content +
                                                     (ulong)(uint)_kjCondition_4._36_4_));
              f_4.exception._7_1_ = 0;
              kj::_::DebugExpression<char_const&>::operator==
                        ((DebugComparison<const_char_&,_char> *)local_168,
                         (DebugExpression<char_const&> *)&local_170,
                         (char *)((long)&f_4.exception + 7));
              bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_168);
              if (bVar2) {
                Text::Reader::Reader
                          ((Reader *)&segment_local,(char *)pwVar1,
                           (ulong)(uint)_kjCondition_4._36_4_);
                return (Reader)_segment_local;
              }
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&,char_const(&)[50]>
                        (&local_180,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x9b7,FAILED,"cptr[unboundedSize] == \'\\0\'",
                         "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                         (DebugComparison<const_char_&,_char> *)local_168,
                         (char (*) [50])"Message contains text that is not NUL-terminated.");
              kj::_::Debug::Fault::~Fault(&local_180);
            }
            else {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[50]>
                        ((Fault *)&cptr,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x9b0,FAILED,"size > ZERO * BYTES",
                         "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                         (DebugComparison<unsigned_int_&,_unsigned_int> *)local_118,
                         (char (*) [50])"Message contains text that is not NUL-terminated.");
              kj::_::Debug::Fault::~Fault((Fault *)&cptr);
            }
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                      ((Fault *)&_kjCondition_3.result,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9ac,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                       "_kjCondition,\"Message contained out-of-bounds text pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)((long)&f_2.exception + 7),
                       (char (*) [320])
                       "Message contained out-of-bounds text pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3.result);
          }
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                    ((Fault *)&stack0xffffffffffffff20,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9a6,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where text was \" \"expected.\""
                     ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)local_d0,
                     (char (*) [85])
                     "Schema mismatch: Message contains list pointer of non-bytes where text was expected."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff20);
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                  (&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9a0,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where text was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    local_88,
                   (char (*) [76])
                   "Schema mismatch: Message contains non-list pointer where text was expected.");
        kj::_::Debug::Fault::~Fault(&local_a0);
      }
    }
  }
  if (pcStack_38 == (char *)0x0) {
    pcStack_38 = "";
  }
  value = pcStack_38;
  uVar3 = unbound<unsigned_int>(ptr._4_4_);
  Text::Reader::Reader((Reader *)&segment_local,value,(ulong)uVar3);
  return (StringPtr)(StringPtr)_segment_local;
}

Assistant:

static KJ_ALWAYS_INLINE(Text::Reader readTextPointer(
      SegmentReader* segment, const WirePointer* ref, const word* refTarget,
      const void* defaultValue, ByteCount defaultSize)) {
    if (ref->isNull()) {
    useDefault:
      if (defaultValue == nullptr) defaultValue = "";
      return Text::Reader(reinterpret_cast<const char*>(defaultValue),
          unbound(defaultSize / BYTES));
    } else {
      const word* ptr;
      KJ_IF_SOME(p, followFars(ref, refTarget, segment)) {
        ptr = &p;
      } else {
        goto useDefault;
      }

      auto size = ref->listRef.elementCount() * (ONE * BYTES / ELEMENTS);

      KJ_REQUIRE(ref->kind() == WirePointer::LIST,
                 "Schema mismatch: Message contains non-list pointer where text was expected.") {
        goto useDefault;
      }

      KJ_REQUIRE(ref->listRef.elementSize() == ElementSize::BYTE,
                 "Schema mismatch: Message contains list pointer of non-bytes where text was "
                 "expected.") {
        goto useDefault;
      }

      KJ_REQUIRE(boundsCheck(segment, ptr, roundBytesUpToWords(size)),
                 "Message contained out-of-bounds text pointer. "
                 OUT_OF_BOUNDS_ERROR_DETAIL) {
        goto useDefault;
      }

      KJ_REQUIRE(size > ZERO * BYTES, "Message contains text that is not NUL-terminated.") {
        goto useDefault;
      }

      const char* cptr = reinterpret_cast<const char*>(ptr);
      uint unboundedSize = unbound(size / BYTES) - 1;

      KJ_REQUIRE(cptr[unboundedSize] == '\0', "Message contains text that is not NUL-terminated.") {
        goto useDefault;
      }

      return Text::Reader(cptr, unboundedSize);
    }
  }